

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_even_first(void)

{
  array<int,_4UL> storage;
  undefined4 local_54;
  int *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 *local_38;
  
  local_48 = 0xb;
  uStack_44 = 0x16;
  uStack_40 = 0x21;
  uStack_3c = 0x2c;
  local_54 = 10;
  local_50 = vista::lower_bound_sorted<int*,int,std::less<int>>(&local_48,&local_38,&local_54);
  local_38 = &local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10)","storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3d2,"void lower_bound_sorted_suite::find_even_first()",&local_50,&local_38);
  local_54 = 0xb;
  local_50 = vista::lower_bound_sorted<int*,int,std::less<int>>(&local_48,&local_38,&local_54);
  local_38 = &local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11)","storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3d4,"void lower_bound_sorted_suite::find_even_first()",&local_50,&local_38);
  local_54 = 0xc;
  local_50 = vista::lower_bound_sorted<int*,int,std::less<int>>(&local_48,&local_38,&local_54);
  local_38 = &uStack_44;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12)",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3d6,"void lower_bound_sorted_suite::find_even_first()",&local_50,&local_38);
  return;
}

Assistant:

void find_even_first()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12),
                  std::next(storage.begin(), 1));
}